

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O3

t_pool * t_pool_init(int qsize,int tsize)

{
  pthread_mutex_t *__mutex;
  undefined8 *puVar1;
  int iVar2;
  t_pool *ptVar3;
  t_pool_worker_t *ptVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  t_pool *local_40;
  
  ptVar3 = (t_pool *)malloc(0x108);
  ptVar3->qsize = qsize;
  ptVar3->tsize = tsize;
  ptVar3->t_stack = (int *)0x0;
  ptVar4 = (t_pool_worker_t *)malloc((long)tsize * 0x50);
  ptVar3->njobs = 0;
  ptVar3->nwaiting = 0;
  *(undefined8 *)&ptVar3->shutdown = 0;
  ptVar3->head = (t_pool_job *)0x0;
  ptVar3->tail = (t_pool_job *)0x0;
  ptVar3->t = ptVar4;
  __mutex = &ptVar3->pool_m;
  local_40 = (t_pool *)0x0;
  pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&ptVar3->empty_c,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&ptVar3->full_c,(pthread_condattr_t *)0x0);
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  piVar5 = (int *)malloc((long)tsize << 2);
  ptVar3->t_stack = piVar5;
  if (piVar5 != (int *)0x0) {
    ptVar3->t_stack_top = -1;
    if (0 < tsize) {
      lVar7 = 0x48;
      uVar6 = 0;
      do {
        ptVar4 = ptVar3->t;
        puVar1 = (undefined8 *)((long)&ptVar4->p + lVar7);
        ptVar3->t_stack[uVar6] = 0;
        puVar1[-9] = ptVar3;
        *(int *)(puVar1 + -8) = (int)uVar6;
        *puVar1 = 0;
        pthread_cond_init((pthread_cond_t *)((long)ptVar4 + lVar7 + -0x30),(pthread_condattr_t *)0x0
                         );
        iVar2 = pthread_create((pthread_t *)((long)ptVar4 + lVar7 + -0x38),(pthread_attr_t *)0x0,
                               t_pool_worker,puVar1 + -9);
        if (iVar2 != 0) {
          return (t_pool *)0x0;
        }
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x50;
      } while ((uint)tsize != uVar6);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_40 = ptVar3;
  }
  return local_40;
}

Assistant:

t_pool *t_pool_init(int qsize, int tsize) {
    int i;
    t_pool *p = malloc(sizeof(*p));
    p->qsize = qsize;
    p->tsize = tsize;
    p->njobs = 0;
    p->nwaiting = 0;
    p->shutdown = 0;
    p->head = p->tail = NULL;
    p->t_stack = NULL;
#ifdef DEBUG_TIME
    p->total_time = p->wait_time = 0;
#endif

    p->t = malloc(tsize * sizeof(p->t[0]));

    pthread_mutex_init(&p->pool_m, NULL);
    pthread_cond_init(&p->empty_c, NULL);
    pthread_cond_init(&p->full_c, NULL);

    pthread_mutex_lock(&p->pool_m);

#ifdef IN_ORDER
    if (!(p->t_stack = malloc(tsize * sizeof(*p->t_stack))))
	return NULL;
    p->t_stack_top = -1;

    for (i = 0; i < tsize; i++) {
	t_pool_worker_t *w = &p->t[i];
	p->t_stack[i] = 0;
	w->p = p;
	w->idx = i;
	w->wait_time = 0;
	pthread_cond_init(&w->pending_c, NULL);
	if (0 != pthread_create(&w->tid, NULL, t_pool_worker, w))
	    return NULL;
    }
#else
    pthread_cond_init(&p->pending_c, NULL);

    for (i = 0; i < tsize; i++) {
	t_pool_worker_t *w = &p->t[i];
	w->p = p;
	w->idx = i;
	pthread_cond_init(&w->pending_c, NULL);
	if (0 != pthread_create(&w->tid, NULL, t_pool_worker, w))
	    return NULL;
    }
#endif

    pthread_mutex_unlock(&p->pool_m);

    return p;
}